

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wire_format_lite.cc
# Opt level: O1

void google::protobuf::internal::WireFormatLite::WriteSFixed32
               (int field_number,int32 value,CodedOutputStream *output)

{
  int32 *piVar1;
  bool bVar2;
  uint uVar3;
  uint8 *puVar4;
  byte *pbVar5;
  byte *pbVar6;
  uint uVar7;
  
  uVar7 = field_number << 3;
  if ((output->impl_).end_ <= output->cur_) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,output->cur_);
    output->cur_ = puVar4;
  }
  pbVar5 = output->cur_;
  if (uVar7 < 0x80) {
    *pbVar5 = (byte)uVar7 | 5;
    pbVar5 = pbVar5 + 1;
  }
  else {
    *pbVar5 = (byte)uVar7 | 0x85;
    if (uVar7 < 0x4000) {
      pbVar5[1] = (byte)(uVar7 >> 7);
      pbVar5 = pbVar5 + 2;
    }
    else {
      pbVar5 = pbVar5 + 2;
      uVar7 = uVar7 >> 7;
      do {
        pbVar6 = pbVar5;
        pbVar6[-1] = (byte)uVar7 | 0x80;
        uVar3 = uVar7 >> 7;
        pbVar5 = pbVar6 + 1;
        bVar2 = 0x3fff < uVar7;
        uVar7 = uVar3;
      } while (bVar2);
      *pbVar6 = (byte)uVar3;
    }
  }
  output->cur_ = pbVar5;
  if ((output->impl_).end_ <= pbVar5) {
    puVar4 = io::EpsCopyOutputStream::EnsureSpaceFallback(&output->impl_,pbVar5);
    output->cur_ = puVar4;
  }
  piVar1 = (int32 *)output->cur_;
  *piVar1 = value;
  output->cur_ = (uint8 *)(piVar1 + 1);
  return;
}

Assistant:

void WireFormatLite::WriteSFixed32(int field_number, int32 value,
                                   io::CodedOutputStream* output) {
  WriteTag(field_number, WIRETYPE_FIXED32, output);
  WriteSFixed32NoTag(value, output);
}